

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_collate_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,CollateExpression *expr,
          idx_t depth)

{
  int iVar1;
  type expr_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  pointer pEVar2;
  ParameterNotResolvedException *this_01;
  BinderException *this_02;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b0;
  LogicalType collation_type;
  LogicalType local_168;
  string local_150;
  ErrorData error;
  ErrorData local_b0;
  
  Bind(&error,this,&expr->child,depth,false);
  if (error.initialized == true) {
    ErrorData::ErrorData(&local_b0,&error);
    BindResult::BindResult(__return_storage_ptr__,&local_b0);
    ErrorData::~ErrorData(&local_b0);
  }
  else {
    expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&expr->child);
    this_00 = BoundExpression::GetExpression(expr_00);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    iVar1 = (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[6])(pEVar2);
    if ((char)iVar1 != '\0') {
      this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_01);
      __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    if ((pEVar2->return_type).id_ != VARCHAR) {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&collation_type,"collations are only supported for type varchar",
                 (allocator *)&local_1b0);
      BinderException::BinderException(this_02,(string *)&collation_type);
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    LogicalType::LogicalType(&local_168,&pEVar2->return_type);
    Value::Value((Value *)&collation_type,&local_168);
    make_uniq_base<duckdb::Expression,duckdb::BoundConstantExpression,duckdb::Value>
              ((duckdb *)&local_1b0,(Value *)&collation_type);
    Value::~Value((Value *)&collation_type);
    LogicalType::~LogicalType(&local_168);
    ::std::__cxx11::string::string((string *)&local_150,(string *)&expr->collation);
    LogicalType::VARCHAR_COLLATION(&collation_type,&local_150);
    ::std::__cxx11::string::~string((string *)&local_150);
    PushCollation(this->context,
                  (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                  &local_1b0,&collation_type,ALL_COLLATIONS);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    LogicalType::operator=(&pEVar2->return_type,&collation_type);
    local_1b8._M_head_impl =
         (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1b8);
    if (local_1b8._M_head_impl != (Expression *)0x0) {
      (*((local_1b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_1b8._M_head_impl = (Expression *)0x0;
    LogicalType::~LogicalType(&collation_type);
    if (local_1b0._M_head_impl != (Expression *)0x0) {
      (*((local_1b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  ErrorData::~ErrorData(&error);
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(CollateExpression &expr, idx_t depth) {
	// first try to bind the child of the cast expression
	auto error = Bind(expr.child, depth);
	if (error.HasError()) {
		return BindResult(std::move(error));
	}
	auto &child = BoundExpression::GetExpression(*expr.child);
	if (child->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (child->return_type.id() != LogicalTypeId::VARCHAR) {
		throw BinderException("collations are only supported for type varchar");
	}
	// Validate the collation, but don't use it
	auto collation_test = make_uniq_base<Expression, BoundConstantExpression>(Value(child->return_type));
	auto collation_type = LogicalType::VARCHAR_COLLATION(expr.collation);
	PushCollation(context, collation_test, collation_type);
	child->return_type = collation_type;
	return BindResult(std::move(child));
}